

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::java::ExtraBuilderInterfaces_abi_cxx11_
          (string *__return_storage_ptr__,java *this,Descriptor *descriptor)

{
  AlphaNum *in_R8;
  AlphaNum local_98;
  AlphaNum local_68;
  undefined8 local_38;
  char *local_30;
  
  local_38 = 0x2f;
  local_30 = "// @@protoc_insertion_point(builder_implements:";
  local_68.piece_._M_len = (size_t)*(ushort *)(*(long *)(this + 0x10) + 2);
  local_68.piece_._M_str = (char *)(~local_68.piece_._M_len + *(long *)(this + 0x10));
  local_98.piece_._M_len = 1;
  local_98.piece_._M_str = ")";
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_38,&local_68,&local_98,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string ExtraBuilderInterfaces(const Descriptor* descriptor) {
  return absl::StrCat("// @@protoc_insertion_point(builder_implements:",
                      descriptor->full_name(), ")");
}